

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_config_free(event_config *cfg)

{
  char *__ptr;
  event_config *peVar1;
  event_config_entry *__ptr_00;
  
  __ptr_00 = (cfg->entries).tqh_first;
  while (__ptr_00 != (event_config_entry *)0x0) {
    peVar1 = (event_config *)(__ptr_00->next).tqe_next;
    if (peVar1 == (event_config *)0x0) {
      peVar1 = cfg;
    }
    (peVar1->entries).tqh_last = (__ptr_00->next).tqe_prev;
    *(__ptr_00->next).tqe_prev = (__ptr_00->next).tqe_next;
    __ptr = __ptr_00->avoid_method;
    if (__ptr != (char *)0x0) {
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(__ptr);
      }
      else {
        (*mm_free_fn_)(__ptr);
      }
    }
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr_00);
    }
    else {
      (*mm_free_fn_)(__ptr_00);
    }
    __ptr_00 = (cfg->entries).tqh_first;
  }
  if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
    (*mm_free_fn_)(cfg);
    return;
  }
  free(cfg);
  return;
}

Assistant:

void
event_config_free(struct event_config *cfg)
{
	struct event_config_entry *entry;

	while ((entry = TAILQ_FIRST(&cfg->entries)) != NULL) {
		TAILQ_REMOVE(&cfg->entries, entry, next);
		event_config_entry_free(entry);
	}
	mm_free(cfg);
}